

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpattern.cc
# Opt level: O2

void __thiscall PatternBlock::normalize(PatternBlock *this)

{
  uint *puVar1;
  pointer puVar2;
  uint uVar3;
  const_iterator cVar4;
  byte bVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  const_iterator __last;
  const_iterator cVar9;
  uint uVar10;
  uint *puVar11;
  uint *puVar12;
  long lVar13;
  int4 i;
  pointer puVar14;
  
  if (this->nonzerosize < 1) {
    this->offset = 0;
    puVar14 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar14) {
      (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar14;
    }
    puVar14 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
              .super__Vector_impl_data._M_start;
    if ((this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar14) {
      (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = puVar14;
    }
  }
  else {
    cVar4._M_current =
         (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    puVar12 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_finish;
    iVar7 = this->offset;
    cVar9._M_current =
         (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
    for (__last._M_current = cVar9._M_current;
        (iVar7 = iVar7 + 4, __last._M_current != puVar12 && (*__last._M_current == 0));
        __last._M_current = __last._M_current + 1) {
      cVar4._M_current = cVar4._M_current + 1;
      this->offset = iVar7;
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase(&this->maskvec,cVar9,__last);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
              (&this->valvec,
               (const_iterator)
               (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start,cVar4);
    puVar12 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_start;
    cVar9._M_current =
         (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (puVar12 != cVar9._M_current) {
      iVar7 = -0x20;
      iVar8 = -4;
      for (uVar10 = *puVar12; uVar10 != 0; uVar10 = uVar10 >> 8) {
        iVar7 = iVar7 + 8;
        iVar8 = iVar8 + 1;
      }
      cVar4._M_current = cVar9._M_current;
      if (iVar7 == 0) {
        puVar14 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        this->offset = this->offset - iVar8;
        bVar5 = -(char)iVar7;
        bVar6 = (char)iVar7 + 0x20;
        for (lVar13 = 0; ((long)cVar9._M_current - (long)puVar12 >> 2) + -1 != lVar13;
            lVar13 = lVar13 + 1) {
          puVar12[lVar13] =
               puVar12[lVar13 + 1] >> (bVar6 & 0x1f) | puVar12[lVar13] << (bVar5 & 0x1f);
        }
        cVar9._M_current[-1] = cVar9._M_current[-1] << (bVar5 & 0x1f);
        puVar2 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        puVar14 = (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        for (lVar13 = 0; ((long)puVar14 - (long)puVar2 >> 2) + -1 != lVar13; lVar13 = lVar13 + 1) {
          puVar2[lVar13] = puVar2[lVar13 + 1] >> (bVar6 & 0x1f) | puVar2[lVar13] << (bVar5 & 0x1f);
        }
        puVar14[-1] = puVar14[-1] << (bVar5 & 0x1f);
      }
      do {
        puVar11 = cVar4._M_current;
        if (cVar4._M_current == puVar12) break;
        puVar11 = cVar4._M_current + -1;
        puVar14 = puVar14 + -1;
        puVar1 = cVar4._M_current + -1;
        cVar4._M_current = puVar11;
      } while (*puVar1 == 0);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                (&this->maskvec,(const_iterator)(puVar11 + 1),cVar9);
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::erase
                (&this->valvec,(const_iterator)(puVar14 + 1),
                 (const_iterator)
                 (this->valvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      puVar12 = (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start;
      cVar9._M_current =
           (this->maskvec).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
    }
    if (puVar12 == cVar9._M_current) {
      this->offset = 0;
      this->nonzerosize = 0;
    }
    else {
      uVar3 = (int)cVar9._M_current - (int)puVar12 & 0xfffffffc;
      this->nonzerosize = uVar3;
      for (uVar10 = cVar9._M_current[-1]; uVar3 = uVar3 - 1, (char)uVar10 == '\0';
          uVar10 = uVar10 >> 8) {
        this->nonzerosize = uVar3;
      }
    }
  }
  return;
}

Assistant:

void PatternBlock::normalize(void)

{
  if (nonzerosize<=0) {		// Check if alwaystrue or alwaysfalse
    offset = 0;			// in which case we don't need mask and value
    maskvec.clear();
    valvec.clear();
    return;
  }
  vector<uintm>::iterator iter1,iter2;
  
  iter1 = maskvec.begin();	// Cut zeros from beginning of mask
  iter2 = valvec.begin();
  while((iter1 != maskvec.end())&&((*iter1)==0)) {
    iter1++;
    iter2++;
    offset += sizeof(uintm);
  }
  maskvec.erase(maskvec.begin(),iter1);
  valvec.erase(valvec.begin(),iter2);

  if (!maskvec.empty()) {
    int4 suboff = 0;		// Cut off unaligned zeros from beginning of mask
    uintm tmp = maskvec[0];
    while(tmp != 0) {
      suboff += 1;
      tmp >>= 8;
    }
    suboff = sizeof(uintm)-suboff;
    if (suboff != 0) {
      offset += suboff;		// Slide up maskvec by suboff bytes
      for(int4 i=0;i<maskvec.size()-1;++i) {
	tmp = maskvec[i] << (suboff*8);
	tmp |= (maskvec[i+1] >> ((sizeof(uintm)-suboff)*8));
	maskvec[i] = tmp;
      }
      maskvec.back() <<= suboff*8;
      for(int4 i=0;i<valvec.size()-1;++i) { // Slide up valvec by suboff bytes
	tmp = valvec[i] << (suboff*8);
	tmp |= (valvec[i+1] >> ((sizeof(uintm)-suboff)*8));
	valvec[i] = tmp;
      }
      valvec.back() <<= suboff*8;
    }
    
    iter1 = maskvec.end();	// Cut zeros from end of mask
    iter2 = valvec.end();
    while(iter1 != maskvec.begin()) {
      --iter1;
      --iter2;
      if ((*iter1) != 0) break; // Find last non-zero
    }
    if (iter1 != maskvec.end()) {
      iter1++;			// Find first zero, in last zero chain
      iter2++;
    }
    maskvec.erase(iter1,maskvec.end());
    valvec.erase(iter2,valvec.end());
  }

  if (maskvec.empty()) {
    offset = 0;
    nonzerosize = 0;		// Always true
    return;
  }
  nonzerosize = maskvec.size() * sizeof(uintm);
  uintm tmp = maskvec.back();	// tmp must be nonzero
  while( (tmp&0xff) == 0) {
    nonzerosize -= 1;
    tmp >>= 8;
  }
}